

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

void arm_rebuild_hflags_arm(CPUARMState *env)

{
  ulong uVar1;
  ulong uVar2;
  ARMMMUIdx fp_el;
  uint32_t uVar3;
  ARMMMUIdx in_ECX;
  ARMMMUIdx mmu_idx;
  uint el;
  
  uVar1 = env->features;
  if (((uint)uVar1 >> 9 & 1) != 0) {
    el = 1;
    if ((env->v7m).exception == 0) {
      el = ~(env->v7m).control[(env->v7m).secure] & 1;
    }
    goto LAB_00586a85;
  }
  if (env->aarch64 != 0) {
    el = env->pstate >> 2 & 3;
    goto LAB_00586a85;
  }
  in_ECX = env->uncached_cpsr & 0x1f;
  if (in_ECX == ARMMMUIdx_E10_0) {
    el = 0;
    goto LAB_00586a85;
  }
  if (in_ECX == ARMMMUIdx_E20_2_PAN) {
LAB_00586a80:
    el = 3;
  }
  else {
    if (in_ECX == ARMMMUIdx_SE3) {
      el = 2;
      goto LAB_00586a85;
    }
    if ((uVar1 >> 0x21 & 1) != 0) {
      if (in_ECX == ARMMMUIdx_E20_2_PAN) {
        el = 3;
        if (((uint)uVar1 >> 0x1c & 1) == 0) goto LAB_00586a85;
      }
      else {
        uVar2 = (env->cp15).scr_el3;
        in_ECX = (ARMMMUIdx)uVar2 & 1;
        if ((uVar1 & 0x10000000) == 0 && (uVar2 & 1) == 0) goto LAB_00586a80;
      }
    }
    el = 1;
  }
LAB_00586a85:
  fp_el = arm_mmu_idx_el_arm(env,el);
  if (env->aarch64 == 0) {
    if ((env->features & 0x200) == 0) {
      uVar3 = rebuild_hflags_a32(env,fp_el,mmu_idx);
    }
    else {
      uVar3 = rebuild_hflags_m32(env,fp_el,mmu_idx);
    }
  }
  else {
    uVar3 = rebuild_hflags_a64(env,el,fp_el,in_ECX);
  }
  env->hflags = uVar3;
  return;
}

Assistant:

void arm_rebuild_hflags(CPUARMState *env)
{
    env->hflags = rebuild_hflags_internal(env);
}